

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O2

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,BeginElement *begin)

{
  State SVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  
  SVar1 = this->m_state;
  if (SVar1 == STATE_ELEMENT) {
    std::operator<<(this->m_rawDst,">");
    SVar1 = this->m_state;
  }
  if (SVar1 - STATE_ELEMENT < 2) {
    std::operator<<(this->m_rawDst,"\n");
    for (iVar3 = 0;
        iVar3 < (int)((ulong)((long)(this->m_elementStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_elementStack).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
        iVar3 = iVar3 + 1) {
      std::operator<<(this->m_rawDst,"  ");
    }
  }
  poVar2 = std::operator<<(this->m_rawDst,"<");
  std::operator<<(poVar2,(string *)begin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_elementStack,&begin->element);
  this->m_state = STATE_ELEMENT;
  return this;
}

Assistant:

Writer& Writer::operator<< (const BeginElement& begin)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << ">";

	if (m_state == STATE_ELEMENT || m_state == STATE_ELEMENT_END)
	{
		m_rawDst << "\n";
		for (int i = 0; i < (int)m_elementStack.size(); i++)
			m_rawDst << "  ";
	}

	m_rawDst << "<" << begin.element;

	m_elementStack.push_back(begin.element);
	m_state = STATE_ELEMENT;

	return *this;
}